

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint64_t roaring_bitmap_get_cardinality(roaring_bitmap_t *r)

{
  int iVar1;
  int local_24;
  uint64_t uStack_20;
  int i;
  uint64_t card;
  roaring_array_t *ra;
  roaring_bitmap_t *r_local;
  
  uStack_20 = 0;
  for (local_24 = 0; local_24 < (r->high_low_container).size; local_24 = local_24 + 1) {
    iVar1 = container_get_cardinality
                      ((r->high_low_container).containers[local_24],
                       (r->high_low_container).typecodes[local_24]);
    uStack_20 = (long)iVar1 + uStack_20;
  }
  return uStack_20;
}

Assistant:

uint64_t roaring_bitmap_get_cardinality(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    uint64_t card = 0;
    for (int i = 0; i < ra->size; ++i)
        card += container_get_cardinality(ra->containers[i], ra->typecodes[i]);
    return card;
}